

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_DoublingFactorCounterTest_LittleFourWinds_TestShell::
TEST_DoublingFactorCounterTest_LittleFourWinds_TestShell
          (TEST_DoublingFactorCounterTest_LittleFourWinds_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_001d9c60;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, LittleFourWinds)
{
	addPair(Tile::EastWind);
	addTriplet(Tile::SouthWind, false);
	addTriplet(Tile::WestWind, false);
	addTriplet(Tile::NorthWind, false);
	addSequence(Tile::TwoOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::LittleFourWinds));
	CHECK_EQUAL(100, r.doubling_factor);
}